

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_voxel_meshify.h
# Opt level: O3

void ogt_mesh_smooth_normals(ogt_voxel_meshify_context *ctx,ogt_mesh *mesh)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar3;
  long lVar6;
  ogt_mesh_vertex *poVar7;
  uint32_t *puVar8;
  int iVar9;
  void *__s;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  ogt_mesh_vertex *poVar16;
  ulong uVar17;
  int iVar18;
  ogt_mesh_vertex *poVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  size_t __size;
  void *__s_00;
  int iVar23;
  void *__s_01;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  
  uVar13 = (ulong)mesh->vertex_count;
  if (uVar13 == 0) {
    uVar13 = 0;
    __s = (void *)0x0;
  }
  else if (ctx->alloc_func == (ogt_voxel_meshify_alloc_func)0x0) {
    __s = malloc(uVar13 * 4);
  }
  else {
    __s = (*ctx->alloc_func)(uVar13 * 4,ctx->alloc_free_user_data);
    uVar13 = (ulong)mesh->vertex_count;
  }
  memset(__s,0xff,uVar13 << 2);
  uVar13 = 1;
  do {
    uVar11 = uVar13;
    uVar14 = (uint)uVar11;
    uVar13 = (ulong)(uVar14 * 2);
  } while (uVar14 < mesh->vertex_count);
  __size = uVar11 << 2;
  if (uVar14 == 0) {
    __s_01 = (void *)0x0;
    memset((void *)0x0,0xff,__size);
    __s_00 = (void *)0x0;
    if (mesh->vertex_count != 0) {
LAB_0010a04e:
      poVar7 = mesh->vertices;
      uVar13 = 0;
      iVar23 = 0;
      poVar16 = poVar7;
      do {
        poVar19 = poVar7 + uVar13;
        lVar10 = 0;
        uVar21 = 0;
        do {
          uVar22 = *(int *)((long)&(poVar16->pos).x + lVar10) * 0x5bd1e995;
          uVar21 = uVar21 * 0x5bd1e995 ^ (uVar22 >> 0x18 ^ uVar22) * 0x5bd1e995;
          lVar10 = lVar10 + 4;
        } while ((int)lVar10 != 0xc);
        uVar22 = 0;
        while( true ) {
          uVar21 = uVar21 & uVar14 - 1;
          uVar11 = (ulong)*(uint *)((long)__s_01 + (ulong)uVar21 * 4);
          if (uVar11 == 0xffffffff) break;
          lVar10._0_4_ = (poVar19->pos).x;
          lVar10._4_4_ = (poVar19->pos).y;
          lVar6._0_4_ = poVar7[uVar11].pos.x;
          lVar6._4_4_ = poVar7[uVar11].pos.y;
          if ((poVar19->pos).z == poVar7[uVar11].pos.z && lVar10 == lVar6) {
            if (uVar13 <= uVar11) {
              __assert_fail("*existing_index < vertex_index",
                            "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                            ,0x198,
                            "uint32_t *hash_table_find_vertex_position(uint32_t *, uint32_t, const ogt_mesh_vertex *, uint32_t)"
                           );
            }
            iVar18 = *(int *)((long)__s + uVar11 * 4);
            iVar9 = iVar23;
            if (iVar18 == -1) {
              __assert_fail("remap_indices[*hash_table_entry] != UINT32_MAX",
                            "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                            ,499,
                            "void ogt_mesh_smooth_normals(const ogt_voxel_meshify_context *, ogt_mesh *)"
                           );
            }
            goto LAB_0010a103;
          }
          uVar21 = uVar21 + uVar22 + 1;
          uVar22 = uVar22 + 1;
          if (uVar14 - 1 < uVar22) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                          ,0x19f,
                          "uint32_t *hash_table_find_vertex_position(uint32_t *, uint32_t, const ogt_mesh_vertex *, uint32_t)"
                         );
          }
        }
        *(int *)((long)__s_01 + (ulong)uVar21 * 4) = (int)uVar13;
        iVar9 = iVar23 + 1;
        iVar18 = iVar23;
LAB_0010a103:
        iVar23 = iVar9;
        *(int *)((long)__s + uVar13 * 4) = iVar18;
        uVar13 = uVar13 + 1;
        poVar16 = poVar16 + 1;
      } while (uVar13 < mesh->vertex_count);
      goto LAB_0010a11f;
    }
  }
  else {
    if (ctx->alloc_func == (ogt_voxel_meshify_alloc_func)0x0) {
      __s_01 = malloc(__size);
    }
    else {
      __s_01 = (*ctx->alloc_func)(__size,ctx->alloc_free_user_data);
    }
    memset(__s_01,0xff,__size);
    if (mesh->vertex_count != 0) goto LAB_0010a04e;
    if (__s_01 == (void *)0x0) {
      __s_01 = (void *)0x0;
      __s_00 = (void *)0x0;
      goto LAB_0010a191;
    }
LAB_0010a11f:
    if (ctx->free_func == (ogt_voxel_meshify_free_func)0x0) {
      free(__s_01);
    }
    else {
      (*ctx->free_func)(__s_01,ctx->alloc_free_user_data);
    }
    __s_01 = (void *)(ulong)mesh->vertex_count;
    if (__s_01 == (void *)0x0) {
      __s_01 = (void *)0x0;
      __s_00 = (void *)0x0;
    }
    else if (ctx->alloc_func == (ogt_voxel_meshify_alloc_func)0x0) {
      __s_00 = malloc((long)__s_01 * 0xc);
    }
    else {
      __s_00 = (*ctx->alloc_func)((long)__s_01 * 0xc,ctx->alloc_free_user_data);
      __s_01 = (void *)(ulong)mesh->vertex_count;
    }
  }
LAB_0010a191:
  uVar13 = 0;
  memset(__s_00,0,(long)__s_01 * 0xc);
  if (mesh->index_count != 0) {
    do {
      poVar7 = mesh->vertices;
      puVar8 = mesh->indices;
      iVar23 = (int)uVar13;
      uVar11 = (ulong)puVar8[uVar13];
      uVar17 = (ulong)puVar8[iVar23 + 1];
      uVar20 = (ulong)puVar8[iVar23 + 2];
      uVar15 = (ulong)*(uint *)((long)__s + uVar11 * 4);
      uVar12 = (ulong)*(uint *)((long)__s + uVar17 * 4);
      fVar27 = poVar7[uVar11].pos.x;
      uVar13 = (ulong)*(uint *)((long)__s + uVar20 * 4);
      fVar25 = poVar7[uVar17].pos.x - fVar27;
      uVar1 = poVar7[uVar11].pos.y;
      uVar4 = poVar7[uVar11].pos.z;
      uVar2 = poVar7[uVar17].pos.y;
      uVar5 = poVar7[uVar17].pos.z;
      fVar24 = poVar7[uVar20].pos.y - (float)uVar1;
      fVar26 = poVar7[uVar20].pos.z - (float)uVar4;
      fVar27 = poVar7[uVar20].pos.x - fVar27;
      fVar28 = ((float)uVar2 - (float)uVar1) * fVar26 - fVar24 * ((float)uVar5 - (float)uVar4);
      fVar26 = ((float)uVar5 - (float)uVar4) * fVar27 - fVar26 * fVar25;
      fVar24 = fVar24 * fVar25 - fVar27 * ((float)uVar2 - (float)uVar1);
      uVar3 = *(undefined8 *)((long)__s_00 + uVar15 * 0xc);
      fVar27 = *(float *)((long)__s_00 + uVar15 * 0xc + 8);
      *(ulong *)((long)__s_00 + uVar15 * 0xc) =
           CONCAT44((float)((ulong)uVar3 >> 0x20) + fVar26,(float)uVar3 + fVar28);
      *(float *)((long)__s_00 + uVar15 * 0xc + 8) = fVar27 + fVar24;
      uVar3 = *(undefined8 *)((long)__s_00 + uVar12 * 0xc);
      fVar27 = *(float *)((long)__s_00 + uVar12 * 0xc + 8);
      *(ulong *)((long)__s_00 + uVar12 * 0xc) =
           CONCAT44((float)((ulong)uVar3 >> 0x20) + fVar26,(float)uVar3 + fVar28);
      *(float *)((long)__s_00 + uVar12 * 0xc + 8) = fVar27 + fVar24;
      uVar3 = *(undefined8 *)((long)__s_00 + uVar13 * 0xc);
      fVar27 = *(float *)((long)__s_00 + uVar13 * 0xc + 8);
      *(ulong *)((long)__s_00 + uVar13 * 0xc) =
           CONCAT44((float)((ulong)uVar3 >> 0x20) + fVar26,(float)uVar3 + fVar28);
      *(float *)((long)__s_00 + uVar13 * 0xc + 8) = fVar24 + fVar27;
      uVar13 = (ulong)(iVar23 + 3U);
    } while (iVar23 + 3U < mesh->index_count);
  }
  uVar14 = mesh->vertex_count;
  if (uVar14 == 0) {
    if (__s_00 == (void *)0x0) goto LAB_0010a3a2;
  }
  else {
    lVar10 = 5;
    uVar13 = 0;
    do {
      uVar11 = (ulong)*(uint *)((long)__s + uVar13 * 4);
      uVar3 = *(undefined8 *)((long)__s_00 + uVar11 * 0xc);
      fVar27 = *(float *)((long)__s_00 + uVar11 * 0xc + 8);
      fVar25 = (float)((ulong)uVar3 >> 0x20);
      fVar24 = (float)uVar3;
      fVar26 = fVar27 * fVar27 + fVar24 * fVar24 + fVar25 * fVar25;
      if (0.001 < fVar26) {
        fVar26 = SQRT(fVar26);
        if (fVar26 <= 0.0) {
          __assert_fail("len > 0.0f",
                        "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                        ,0x127,"ogt_mesh_vec3 _normalize3(const ogt_mesh_vec3 &)");
        }
        fVar26 = 1.0 / fVar26;
        poVar7 = mesh->vertices;
        *(ulong *)((long)poVar7 + lVar10 * 4 + -8) = CONCAT44(fVar25 * fVar26,fVar24 * fVar26);
        (&(poVar7->pos).x)[lVar10] = fVar27 * fVar26;
        uVar14 = mesh->vertex_count;
      }
      uVar13 = uVar13 + 1;
      lVar10 = lVar10 + 8;
    } while (uVar13 < uVar14);
  }
  if (ctx->free_func == (ogt_voxel_meshify_free_func)0x0) {
    free(__s_00);
  }
  else {
    (*ctx->free_func)(__s_00,ctx->alloc_free_user_data);
  }
LAB_0010a3a2:
  if (__s == (void *)0x0) {
    return;
  }
  if (ctx->free_func == (ogt_voxel_meshify_free_func)0x0) {
    free(__s);
    return;
  }
  (*ctx->free_func)(__s,ctx->alloc_free_user_data);
  return;
}

Assistant:

void ogt_mesh_smooth_normals(const ogt_voxel_meshify_context* ctx, ogt_mesh* mesh) {
    // generate an remap table for vertex indices based on the vertex positions.
    uint32_t* remap_indices = (uint32_t*)_voxel_meshify_malloc(ctx, sizeof(uint32_t) * mesh->vertex_count);
    memset(remap_indices, -1, mesh->vertex_count * sizeof(uint32_t));
    {
        // allocate a hash table that is sized at the next power of 2 above the vertex count
        uint32_t hash_table_size = 1;
        while (hash_table_size < mesh->vertex_count)
            hash_table_size *= 2;
        uint32_t hash_table_mask = hash_table_size - 1;
        uint32_t* hash_table = (uint32_t*)_voxel_meshify_malloc(ctx, sizeof(uint32_t) * hash_table_size);
        memset(hash_table, -1, hash_table_size * sizeof(uint32_t));

        // create a unique mapping for each vertex based purely on its position
        uint32_t num_unique_vertices = 0;
        for (uint32_t vertex_index = 0; vertex_index < mesh->vertex_count; vertex_index++) {
            uint32_t* hash_table_entry = hash_table_find_vertex_position(hash_table, hash_table_mask, mesh->vertices, vertex_index);
            if (*hash_table_entry == UINT32_MAX) {
                // vertex is not already in the hash table. allocate a unique index for it.
                *hash_table_entry = vertex_index;
                remap_indices[vertex_index] = num_unique_vertices++;
            }
            else {
                // vertex is already in the hash table. Point this to the index that is already existing!
                assert(remap_indices[*hash_table_entry] != UINT32_MAX);
                remap_indices[vertex_index] = remap_indices[*hash_table_entry];
            }
        }
        // now that we have remap_indices, we no longer need the hash table. 
        _voxel_meshify_free(ctx, hash_table);
    }

    // for each triangle face, add the normal of the face to the unique normal for the vertex
    ogt_mesh_vec3* remap_normals = (ogt_mesh_vec3*)_voxel_meshify_malloc(ctx, sizeof(ogt_mesh_vec3) * mesh->vertex_count);
    memset(remap_normals, 0, sizeof(ogt_mesh_vec3) * mesh->vertex_count);

    for (uint32_t i = 0; i < mesh->index_count; i += 3) {
        uint32_t i0 = mesh->indices[i + 0];
        uint32_t i1 = mesh->indices[i + 1];
        uint32_t i2 = mesh->indices[i + 2];
        ogt_mesh_vertex v0 = mesh->vertices[i0];
        ogt_mesh_vertex v1 = mesh->vertices[i1];
        ogt_mesh_vertex v2 = mesh->vertices[i2];
        ogt_mesh_vec3 normal = _cross3(_sub3(v1.pos, v0.pos), _sub3(v2.pos, v0.pos));

        uint32_t ri0 = remap_indices[i0];
        uint32_t ri1 = remap_indices[i1];
        uint32_t ri2 = remap_indices[i2];
        remap_normals[ri0] = _add3(remap_normals[ri0], normal);
        remap_normals[ri1] = _add3(remap_normals[ri1], normal);
        remap_normals[ri2] = _add3(remap_normals[ri2], normal);
    }

    // for each vertex, copy over remap normal if it's non-zero.
    for (uint32_t vertex_index = 0; vertex_index < mesh->vertex_count; vertex_index++) {
        ogt_mesh_vec3 accumulated_normal = remap_normals[remap_indices[vertex_index]];
        if (_dot3(accumulated_normal, accumulated_normal) > 0.001f)
            mesh->vertices[vertex_index].normal = _normalize3(accumulated_normal);
    }

    _voxel_meshify_free(ctx, remap_normals);
    _voxel_meshify_free(ctx, remap_indices);
}